

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam.cpp
# Opt level: O0

void InitRectifyMap(void)

{
  bool bVar1;
  MatCommaInitializer_<double> *pMVar2;
  MatCommaInitializer_ *this;
  ostream *poVar3;
  double dVar4;
  Size_<int> local_4e8;
  Mat local_4e0 [96];
  Mat local_480 [96];
  Mat local_420 [96];
  Mat local_3c0 [96];
  Mat local_360 [96];
  Size_<int> local_300;
  Mat local_2f8 [96];
  Mat local_298 [96];
  Mat local_238 [96];
  Mat local_1d8 [96];
  Mat local_178 [100];
  Size_<int> local_114;
  Size img_size;
  Mat_<double> local_100;
  MatCommaInitializer_<double> local_a0;
  Mat_<double> local_78;
  double local_18;
  double focal;
  double vfov_rad;
  
  focal = ((double)vfov_now * 3.141592653589793) / 180.0;
  dVar4 = (double)height_now;
  local_18 = tan(focal * 0.5);
  local_18 = (dVar4 * 0.5) / local_18;
  cv::Mat_<double>::Mat_(&local_100,3,3);
  cv::operator<<(&local_a0,&local_100,local_18);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(&local_a0,0.0);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,(double)width_now * 0.5 + -0.5);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,0.0);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,local_18);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,(double)height_now * 0.5 + -0.5);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,0.0);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,0.0);
  this = (MatCommaInitializer_ *)cv::MatCommaInitializer_<double>::operator_(pMVar2,1.0);
  cv::MatCommaInitializer_::operator_cast_to_Mat_(&local_78,this);
  cv::Mat::operator=((Mat *)Knew,&local_78.super_Mat);
  cv::Mat_<double>::~Mat_(&local_78);
  cv::Mat_<double>::~Mat_(&local_100);
  cv::Size_<int>::Size_(&local_114,width_now,height_now);
  cv::Mat::Mat(local_178,(Mat *)Kl);
  cv::Mat::Mat(local_1d8,(Mat *)Dl);
  cv::Mat::Mat(local_238,(Mat *)xil);
  cv::Mat::Mat(local_298,(Mat *)Rl);
  cv::Mat::Mat(local_2f8,(Mat *)Knew);
  cv::Size_<int>::Size_(&local_300,&local_114);
  InitUndistortRectifyMap
            (local_178,local_1d8,local_238,local_298,local_2f8,&local_300,(Mat *)smap,
             (Mat *)(smap + 0x60));
  cv::Mat::~Mat(local_2f8);
  cv::Mat::~Mat(local_298);
  cv::Mat::~Mat(local_238);
  cv::Mat::~Mat(local_1d8);
  cv::Mat::~Mat(local_178);
  poVar3 = std::operator<<((ostream *)&std::cout,"Width: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,width_now);
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::operator<<(poVar3,"Height: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,height_now);
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::operator<<(poVar3,"V.Fov: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,vfov_now);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"K Matrix: \n");
  poVar3 = cv::operator<<(poVar3,(Mat *)Knew);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  bVar1 = std::operator==(&cam_model_abi_cxx11_,"stereo");
  if (bVar1) {
    cv::Mat::Mat(local_360,(Mat *)Kr);
    cv::Mat::Mat(local_3c0,(Mat *)Dr);
    cv::Mat::Mat(local_420,(Mat *)xir);
    cv::Mat::Mat(local_480,(Mat *)Rr);
    cv::Mat::Mat(local_4e0,(Mat *)Knew);
    cv::Size_<int>::Size_(&local_4e8,&local_114);
    InitUndistortRectifyMap
              (local_360,local_3c0,local_420,local_480,local_4e0,&local_4e8,(Mat *)(smap + 0xc0),
               (Mat *)(smap + 0x120));
    cv::Mat::~Mat(local_4e0);
    cv::Mat::~Mat(local_480);
    cv::Mat::~Mat(local_420);
    cv::Mat::~Mat(local_3c0);
    cv::Mat::~Mat(local_360);
    poVar3 = std::operator<<((ostream *)&std::cout,"Ndisp: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,ndisp_now);
    poVar3 = std::operator<<(poVar3,"\t");
    poVar3 = std::operator<<(poVar3,"Wsize: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,wsize_now);
    std::operator<<(poVar3,"\n");
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void InitRectifyMap() {
  double vfov_rad = vfov_now * CV_PI / 180.;
  double focal = height_now / 2. / tan(vfov_rad / 2.);
  Knew = (cv::Mat_<double>(3, 3) << focal, 0., width_now  / 2. - 0.5,
                                    0., focal, height_now / 2. - 0.5,
                                    0., 0., 1.);

  cv::Size img_size(width_now, height_now);

  InitUndistortRectifyMap(Kl, Dl, xil, Rl, Knew,
                          img_size, smap[0][0], smap[0][1]);

  std::cout << "Width: "  << width_now  << "\t"
            << "Height: " << height_now << "\t"
            << "V.Fov: "  << vfov_now   << "\n";
  std::cout << "K Matrix: \n" << Knew << std::endl;

  if (cam_model == "stereo") {
    InitUndistortRectifyMap(Kr, Dr, xir, Rr, Knew,
                            img_size, smap[1][0], smap[1][1]);
    std::cout << "Ndisp: " << ndisp_now << "\t"
              << "Wsize: " << wsize_now << "\n";
  }
  std::cout << std::endl;
}